

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetTapScriptTreeInfo
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::GetTapScriptTreeInfoRequestStruct_&)>
  local_58;
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::GetTapScriptTreeInfoRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::GetTapScriptTreeInfoRequestStruct_const&)>
  ::
  function<cfd::js::api::TapScriptInfoStruct(&)(cfd::js::api::GetTapScriptTreeInfoRequestStruct_const&),void>
            ((function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::GetTapScriptTreeInfoRequestStruct_const&)>
              *)&local_38,AddressStructApi::GetTapScriptTreeInfo);
  std::
  function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::GetTapScriptTreeInfoRequestStruct_const&)>
  ::
  function<cfd::js::api::TapScriptInfoStruct(&)(cfd::js::api::GetTapScriptTreeInfoRequestStruct_const&),void>
            ((function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::GetTapScriptTreeInfoRequestStruct_const&)>
              *)&local_58,ElementsAddressStructApi::GetTapScriptTreeInfo);
  ExecuteElementsCheckApi<cfd::js::api::json::GetTapScriptTreeInfoRequest,cfd::js::api::json::TapScriptInfo,cfd::js::api::GetTapScriptTreeInfoRequestStruct,cfd::js::api::TapScriptInfoStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::GetTapScriptTreeInfoRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::GetTapScriptTreeInfoRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetTapScriptTreeInfo(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::GetTapScriptTreeInfoRequest, api::json::TapScriptInfo,
      api::GetTapScriptTreeInfoRequestStruct, api::TapScriptInfoStruct>(
      request_message, AddressStructApi::GetTapScriptTreeInfo,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressStructApi::GetTapScriptTreeInfo);
#else
      AddressStructApi::GetTapScriptTreeInfo);
#endif
}